

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O3

bool spvtools::val::anon_unknown_0::IsConstWithIntScalarType
               (ValidationState_t *_,Instruction *inst,uint32_t word_index)

{
  bool bVar1;
  Instruction *pIVar2;
  
  pIVar2 = ValidationState_t::FindDef
                     (_,*(uint32_t *)
                         ((long)&(inst->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + (ulong)word_index * 4));
  if (((pIVar2->inst_).opcode == 0x2b) &&
     (bVar1 = ValidationState_t::IsIntScalarType(_,(pIVar2->inst_).type_id), bVar1)) {
    return true;
  }
  return false;
}

Assistant:

bool IsConstWithIntScalarType(ValidationState_t& _, const Instruction* inst,
                              uint32_t word_index) {
  auto* int_scalar_const = _.FindDef(inst->word(word_index));
  if (int_scalar_const->opcode() == spv::Op::OpConstant &&
      _.IsIntScalarType(int_scalar_const->type_id())) {
    return true;
  }
  return false;
}